

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v6::internal::
numeric_specs_checker<fmt::v6::internal::dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>_>_>
::check_sign(numeric_specs_checker<fmt::v6::internal::dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>_>_>
             *this)

{
  type tVar1;
  
  require_numeric_argument(this);
  tVar1 = this->arg_type_;
  if ((tVar1 - named_arg_type < 9) &&
     ((char_type < tVar1 || ((0x214U >> (tVar1 & (custom_type|pointer_type)) & 1) == 0)))) {
    dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>_>
    ::on_error(this->error_handler_,"format specifier requires signed argument");
    return;
  }
  return;
}

Assistant:

FMT_CONSTEXPR void check_sign() {
    require_numeric_argument();
    if (is_integral_type(arg_type_) && arg_type_ != int_type &&
        arg_type_ != long_long_type && arg_type_ != internal::char_type) {
      error_handler_.on_error("format specifier requires signed argument");
    }
  }